

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleSourceMode(cmSetPropertyCommand *this)

{
  cmMakefile *this_00;
  bool bVar1;
  reference pbVar2;
  cmSourceFile *sf_00;
  ostream *poVar3;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream e;
  cmSourceFile *sf;
  _Self local_20;
  const_iterator ni;
  cmSetPropertyCommand *this_local;
  
  ni._M_node = (_Base_ptr)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->Names);
  while( true ) {
    sf = (cmSourceFile *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Names);
    bVar1 = std::operator!=(&local_20,(_Self *)&sf);
    if (!bVar1) {
      return true;
    }
    this_00 = (this->super_cmCommand).Makefile;
    pbVar2 = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    sf_00 = cmMakefile::GetOrCreateSource(this_00,pbVar2,false);
    if (sf_00 == (cmSourceFile *)0x0) break;
    bVar1 = HandleSource(this,sf_00);
    if (!bVar1) {
      return false;
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar3 = std::operator<<((ostream *)local_1a8,
                           "given SOURCE name that could not be found or created: ");
  pbVar2 = std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_20);
  std::operator<<(poVar3,(string *)pbVar2);
  std::__cxx11::ostringstream::str();
  cmCommand::SetError(&this->super_cmCommand,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleSourceMode()
{
  for (std::set<std::string>::const_iterator ni = this->Names.begin();
       ni != this->Names.end(); ++ni) {
    // Get the source file.
    if (cmSourceFile* sf = this->Makefile->GetOrCreateSource(*ni)) {
      if (!this->HandleSource(sf)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "given SOURCE name that could not be found or created: " << *ni;
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}